

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  u32 uVar1;
  ExprList *pEVar2;
  FuncDef *p;
  long lVar3;
  int p2;
  int iVar4;
  Vdbe *v;
  AggInfo_func *pAVar5;
  
  if (0 < pAggInfo->nFunc) {
    pAVar5 = pAggInfo->aFunc;
    iVar4 = 0;
    do {
      pEVar2 = (pAVar5->pExpr->x).pList;
      p2 = 0;
      if (pEVar2 != (ExprList *)0x0) {
        p2 = pEVar2->nExpr;
      }
      sqlite3VdbeAddOp3((Vdbe *)pParse,0x9e,pAVar5->iMem,p2,0);
      p = pAVar5->pFunc;
      if (pParse->db->mallocFailed == '\0') {
        lVar3 = *(long *)&(pParse->constraintName).n;
        uVar1 = pParse->oldmask;
        *(undefined1 *)(lVar3 + -0x17 + (long)(int)uVar1 * 0x18) = 0xf8;
        *(FuncDef **)(lVar3 + -8 + (long)(int)uVar1 * 0x18) = p;
      }
      else if ((p->funcFlags & 0x10) != 0) {
        sqlite3DbFreeNN(pParse->db,p);
      }
      iVar4 = iVar4 + 1;
      pAVar5 = pAVar5 + 1;
    } while (iVar4 < pAggInfo->nFunc);
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    sqlite3VdbeAddOp2(v, OP_AggFinal, pF->iMem, pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}